

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen10Texture.cpp
# Opt level: O1

void __thiscall
GmmLib::GmmGen10TextureCalc::GetMipTailGeometryOffset
          (GmmGen10TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint32_t MipLevel,uint32_t *OffsetX,
          uint32_t *OffsetY,uint32_t *OffsetZ)

{
  GMM_RESOURCE_TYPE GVar1;
  uint32_t uVar2;
  anon_struct_8_44_94931171_for_Info aVar3;
  GMM_MIPTAIL_SLOT_OFFSET (*paGVar4) [5];
  uint uVar5;
  long lVar6;
  
  if ((((((this->super_GmmGen9TextureCalc).super_GmmTextureCalc.pGmmLibContext)->SkuTable).field_1.
        field_0x1 & 0x80) == 0) || (GVar1 = pTexInfo->Type, GVar1 == RESOURCE_3D)) {
    GmmGen9TextureCalc::GetMipTailGeometryOffset
              (&this->super_GmmGen9TextureCalc,pTexInfo,MipLevel,OffsetX,OffsetY,OffsetZ);
    return;
  }
  uVar2 = pTexInfo->BitsPerPixel;
  uVar5 = uVar2 << 0x1d | uVar2 - 8 >> 3;
  if (uVar5 < 8) {
    lVar6 = *(long *)(&DAT_001c8280 + (ulong)uVar5 * 8);
  }
  else {
    lVar6 = 0;
  }
  if ((GVar1 != RESOURCE_CUBE) && (GVar1 != RESOURCE_2D)) {
    if (GVar1 != RESOURCE_1D) {
      return;
    }
    uVar5 = (SUB84((pTexInfo->Flags).Info,4) >> 3 & 4) +
            (MipLevel - (pTexInfo->Alignment).MipTailStartLod);
    paGVar4 = Gen10MipTailSlotOffset1DSurface;
    goto LAB_001b3270;
  }
  aVar3 = (pTexInfo->Flags).Info;
  if (((ulong)aVar3 >> 0x26 & 1) == 0) {
LAB_001b31fc:
    if ((((ulong)aVar3 >> 0x25 & 1) == 0) ||
       ((uVar5 = 0xb, (pTexInfo->MSAA).NumSamples != 0x10 &&
        ((((ulong)aVar3 >> 0x25 & 1) == 0 ||
         ((uVar5 = 10, (pTexInfo->MSAA).NumSamples != 8 &&
          ((((ulong)aVar3 >> 0x25 & 1) == 0 ||
           ((uVar5 = 8, (pTexInfo->MSAA).NumSamples != 4 &&
            ((((ulong)aVar3 >> 0x25 & 1) == 0 || (uVar5 = 5, (pTexInfo->MSAA).NumSamples != 2)))))))
          ))))))) {
      uVar5 = aVar3._4_4_ >> 3 & 4;
    }
  }
  else {
    uVar5 = 4;
    if ((pTexInfo->MSAA).NumSamples != 0x10) {
      if (((ulong)aVar3 >> 0x26 & 1) == 0) goto LAB_001b31fc;
      uVar5 = 3;
      if ((pTexInfo->MSAA).NumSamples != 8) {
        if (((ulong)aVar3 >> 0x26 & 1) == 0) goto LAB_001b31fc;
        uVar5 = 2;
        if ((pTexInfo->MSAA).NumSamples != 4) {
          if (((ulong)aVar3 >> 0x26 & 1) == 0) goto LAB_001b31fc;
          uVar5 = (uint)((pTexInfo->MSAA).NumSamples == 2);
        }
      }
    }
  }
  uVar5 = (MipLevel - (pTexInfo->Alignment).MipTailStartLod) + uVar5;
  paGVar4 = Gen10MipTailSlotOffset2DSurface;
LAB_001b3270:
  *OffsetX = uVar2 * paGVar4[uVar5][lVar6].X >> 3;
  *OffsetY = paGVar4[uVar5][lVar6].Y;
  *OffsetZ = paGVar4[uVar5][lVar6].Z;
  return;
}

Assistant:

void GmmLib::GmmGen10TextureCalc::GetMipTailGeometryOffset(GMM_TEXTURE_INFO *pTexInfo,
                                                           uint32_t          MipLevel,
                                                           uint32_t *        OffsetX,
                                                           uint32_t *        OffsetY,
                                                           uint32_t *        OffsetZ)
{
    uint32_t ArrayIndex = 0;
    uint32_t Slot       = 0;

    GMM_DPF_ENTER;

    // 3D textures follow the Gen9 mip tail format
    if(!pGmmLibContext->GetSkuTable().FtrStandardMipTailFormat ||
       pTexInfo->Type == RESOURCE_3D)
    {
        return GmmGen9TextureCalc::GetMipTailGeometryOffset(pTexInfo, MipLevel, OffsetX, OffsetY, OffsetZ);
    }

    switch(pTexInfo->BitsPerPixel)
    {
        case 128:
            ArrayIndex = 0;
            break;
        case 64:
            ArrayIndex = 1;
            break;
        case 32:
            ArrayIndex = 2;
            break;
        case 16:
            ArrayIndex = 3;
            break;
        case 8:
            ArrayIndex = 4;
            break;
        default:
            __GMM_ASSERT(0);
            break;
    }

    if(pTexInfo->Type == RESOURCE_1D)
    {
        Slot = MipLevel - pTexInfo->Alignment.MipTailStartLod +
               (pTexInfo->Flags.Info.TiledYf ? 4 : 0);

        *OffsetX = Gen10MipTailSlotOffset1DSurface[Slot][ArrayIndex].X * pTexInfo->BitsPerPixel / 8;
        *OffsetY = Gen10MipTailSlotOffset1DSurface[Slot][ArrayIndex].Y;
        *OffsetZ = Gen10MipTailSlotOffset1DSurface[Slot][ArrayIndex].Z;
    }
    else if(pTexInfo->Type == RESOURCE_2D || pTexInfo->Type == RESOURCE_CUBE)
    {
        // clang-format off
        Slot = MipLevel - pTexInfo->Alignment.MipTailStartLod +
               // TileYs
               ((pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples == 16) ? 4 :
               (pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples == 8) ? 3 :
               (pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples == 4) ? 2 :
               (pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples == 2) ? 1 :
               (pTexInfo->Flags.Info.TiledYs) ? 0 :
               // TileYf
               (pTexInfo->Flags.Info.TiledYf && pTexInfo->MSAA.NumSamples == 16) ? 11 :
               (pTexInfo->Flags.Info.TiledYf && pTexInfo->MSAA.NumSamples == 8) ? 10 :
               (pTexInfo->Flags.Info.TiledYf && pTexInfo->MSAA.NumSamples == 4) ? 8 :
               (pTexInfo->Flags.Info.TiledYf && pTexInfo->MSAA.NumSamples == 2) ? 5 :
               (pTexInfo->Flags.Info.TiledYf) ? 4 : 0);
        // clang-format on

        *OffsetX = Gen10MipTailSlotOffset2DSurface[Slot][ArrayIndex].X * pTexInfo->BitsPerPixel / 8;
        *OffsetY = Gen10MipTailSlotOffset2DSurface[Slot][ArrayIndex].Y;
        *OffsetZ = Gen10MipTailSlotOffset2DSurface[Slot][ArrayIndex].Z;
    }

    GMM_DPF_EXIT;
    return;
}